

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * indexInAffinityOk(Parse *pParse,WhereTerm *pTerm,u8 idxaff)

{
  Select *pSVar1;
  int iVar2;
  uint uVar3;
  CollSeq *pCVar4;
  char *pcVar5;
  u8 uVar6;
  long lVar7;
  Select *pSVar8;
  Expr *pExpr;
  long in_FS_OFFSET;
  undefined1 *local_68;
  anon_union_8_2_443a03b8_for_u aStack_60;
  Expr *local_58;
  Expr *pEStack_50;
  anon_union_8_2_a01b6dbf_for_x local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  AggInfo *pAStack_30;
  anon_union_8_3_c79b3df9_for_y local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pExpr = pTerm->pExpr;
  pSVar1 = (Select *)pExpr->pLeft;
  uVar6 = pSVar1->op;
  if (uVar6 == 0xb0) {
    uVar6 = *(u8 *)&pSVar1->nSelectRow;
  }
  local_28.pTab = (Table *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pAStack_30 = (AggInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.pList = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
  pEStack_50 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  aStack_60.zToken = &DAT_aaaaaaaaaaaaaaaa;
  pSVar8 = pSVar1;
  if (uVar6 != 0xb1) {
    if (uVar6 != 0x8b) goto LAB_0019a532;
    pSVar8 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar1->pEList)->pSelect;
  }
  if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar8->pEList)->pList->nExpr) {
    lVar7 = (long)(pTerm->u).x.iField;
    local_68 = (undefined1 *)0xaaaaaa36;
    local_58 = pSVar1->pEList->a[lVar7 + -1].pExpr;
    pEStack_50 = ((pExpr->x).pSelect)->pEList->a[lVar7 + -1].pExpr;
    pExpr = (Expr *)&local_68;
  }
LAB_0019a532:
  iVar2 = sqlite3IndexAffinityOk(pExpr,idxaff);
  if (iVar2 == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    uVar3 = pExpr->flags & 0x400;
    pCVar4 = sqlite3BinaryCompareCollSeq
                       (pParse,*(Expr **)((long)&pExpr->pLeft + (ulong)(uVar3 >> 7)),
                        (&pExpr->pLeft)[uVar3 == 0]);
    if (pCVar4 == (CollSeq *)0x0) {
      pcVar5 = "BINARY";
    }
    else {
      pcVar5 = pCVar4->zName;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pcVar5;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE const char *indexInAffinityOk(
  Parse *pParse,
  WhereTerm *pTerm,
  u8 idxaff
){
  Expr *pX = pTerm->pExpr;
  Expr inexpr;

  assert( pTerm->eOperator & WO_IN );

  if( sqlite3ExprIsVector(pX->pLeft) ){
    int iField = pTerm->u.x.iField - 1;
    inexpr.flags = 0;
    inexpr.op = TK_EQ;
    inexpr.pLeft = pX->pLeft->x.pList->a[iField].pExpr;
    assert( ExprUseXSelect(pX) );
    inexpr.pRight = pX->x.pSelect->pEList->a[iField].pExpr;
    pX = &inexpr;
  }

  if( sqlite3IndexAffinityOk(pX, idxaff) ){
    CollSeq *pRet = sqlite3ExprCompareCollSeq(pParse, pX);
    return pRet ? pRet->zName : sqlite3StrBINARY;
  }
  return 0;
}